

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O3

void __thiscall
COLLADASaxFWL::KinematicsFloatOrParam::setParamValue
          (KinematicsFloatOrParam *this,String *paramValue)

{
  pointer pcVar1;
  String *pSVar2;
  
  deleteParam(this);
  pSVar2 = (String *)operator_new(0x20);
  (pSVar2->_M_dataplus)._M_p = (pointer)&pSVar2->field_2;
  pcVar1 = (paramValue->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pSVar2,pcVar1,pcVar1 + paramValue->_M_string_length);
  (this->mValue)._param = pSVar2;
  this->mValueType = VALUETYPE_PARAM;
  return;
}

Assistant:

void setParamValue( const String& paramValue) { deleteParam(); mValue._param = new String(paramValue); mValueType = VALUETYPE_PARAM; }